

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManDupTrimmed(Gia_Man_t *p,int fTrimCis,int fTrimCos,int fDualOut,int OutValue)

{
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  undefined8 uVar4;
  uint uVar5;
  int iVar6;
  Vec_Int_t *__ptr;
  Gia_Man_t *p_00;
  size_t sVar7;
  char *pcVar8;
  Gia_Obj_t *pGVar9;
  Gia_Obj_t *pGVar10;
  Gia_Man_t *pGVar11;
  Vec_Int_t *pVVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  
  if (fTrimCos == 0 || fDualOut == 0) {
    __ptr = (Vec_Int_t *)0x0;
  }
  else {
    __ptr = Gia_ManDupTrimmedNonZero(p);
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar2);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar2);
  }
  p_00->pName = pcVar8;
  pcVar2 = p->pSpec;
  uVar17 = 0;
  if (pcVar2 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar2);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar2);
  }
  p_00->pSpec = pcVar8;
  Gia_ManCreateRefs(p);
  uVar13 = p->vCis->nSize;
  uVar5 = uVar13 - p->nRegs;
  if (uVar5 != 0 && p->nRegs <= (int)uVar13) {
    uVar17 = 0;
    uVar15 = (ulong)uVar13;
    if ((int)uVar13 < 1) {
      uVar15 = uVar17;
    }
    do {
      if (uVar15 == uVar17) goto LAB_001e58a2;
      iVar6 = p->vCis->pArray[uVar17];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_001e5845;
      if ((fTrimCis == 0) || ((p->pObjs == (Gia_Obj_t *)0x0 || (p->pRefs[iVar6] != 0))))
      goto LAB_001e51cb;
      uVar17 = uVar17 + 1;
    } while (uVar5 != uVar17);
    uVar17 = (ulong)uVar5;
  }
LAB_001e51cb:
  if ((uint)uVar17 != uVar5) {
LAB_001e526e:
    pGVar11 = p;
    Gia_ManFillValue(p);
    p->pObjs->Value = 0;
    pVVar12 = p->vCis;
    uVar17 = (ulong)(uint)pVVar12->nSize;
    if (0 < pVVar12->nSize) {
      lVar19 = 0;
      do {
        iVar6 = pVVar12->pArray[lVar19];
        lVar14 = (long)iVar6;
        if ((lVar14 < 0) || (p->nObjs <= iVar6)) goto LAB_001e5845;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar11 = (Gia_Man_t *)(lVar14 * 3);
        pGVar3 = p->pObjs + lVar14;
        if (fTrimCis == 0) {
LAB_001e52e3:
          pGVar10 = Gia_ManAppendObj(p_00);
          uVar17 = *(ulong *)pGVar10;
          *(ulong *)pGVar10 = uVar17 | 0x9fffffff;
          *(ulong *)pGVar10 =
               uVar17 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar9 = p_00->pObjs;
          if ((pGVar10 < pGVar9) || (pGVar9 + p_00->nObjs <= pGVar10)) goto LAB_001e5864;
          pGVar11 = (Gia_Man_t *)p_00->vCis;
          Vec_IntPush((Vec_Int_t *)pGVar11,
                      (int)((ulong)((long)pGVar10 - (long)pGVar9) >> 2) * -0x55555555);
          pGVar9 = p_00->pObjs;
          if ((pGVar10 < pGVar9) || (pGVar9 + p_00->nObjs <= pGVar10)) goto LAB_001e5864;
          pGVar3->Value = (int)((ulong)((long)pGVar10 - (long)pGVar9) >> 2) * 0x55555556;
        }
        else {
          if (p->nObjs <= iVar6) goto LAB_001e5864;
          if ((p->pRefs[lVar14] != 0) ||
             ((uVar4 = *(undefined8 *)pGVar3, ((uint)uVar4 & 0x9fffffff) == 0x9fffffff &&
              ((int)uVar17 - p->nRegs <= (int)((uint)((ulong)uVar4 >> 0x20) & 0x1fffffff)))))
          goto LAB_001e52e3;
        }
        lVar19 = lVar19 + 1;
        pVVar12 = p->vCis;
        uVar17 = (ulong)pVVar12->nSize;
      } while (lVar19 < (long)uVar17);
    }
    if (0 < p->nObjs) {
      lVar19 = 8;
      lVar14 = 0;
      do {
        pGVar3 = p->pObjs;
        if (pGVar3 == (Gia_Obj_t *)0x0) break;
        uVar17 = *(ulong *)((long)pGVar3 + lVar19 + -8);
        if ((uVar17 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar17) {
          uVar13 = *(uint *)((long)pGVar3 +
                            lVar19 + (ulong)(uint)((int)(uVar17 & 0x1fffffff) << 2) * -3);
          if (((int)uVar13 < 0) ||
             (uVar5 = *(uint *)((long)pGVar3 +
                               lVar19 + (ulong)((uint)(uVar17 >> 0x1e) & 0x7ffffffc) * -3),
             (int)uVar5 < 0)) goto LAB_001e5883;
          pGVar11 = p_00;
          iVar6 = Gia_ManAppendAnd(p_00,uVar13 ^ (uint)(uVar17 >> 0x1d) & 1,
                                   uVar5 ^ (uint)(uVar17 >> 0x3d) & 1);
          *(int *)(&pGVar3->field_0x0 + lVar19) = iVar6;
        }
        lVar14 = lVar14 + 1;
        lVar19 = lVar19 + 0xc;
      } while (lVar14 < p->nObjs);
    }
    if (fTrimCos == 0 || fDualOut == 0) {
      pVVar12 = p->vCos;
      uVar17 = (ulong)(uint)pVVar12->nSize;
      lVar19 = 0;
      if (p->nRegs < pVVar12->nSize) {
        lVar19 = 0;
        do {
          if ((int)uVar17 <= lVar19) goto LAB_001e58a2;
          iVar6 = pVVar12->pArray[lVar19];
          if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_001e5845;
          if ((fTrimCos == 0) ||
             ((p->pObjs == (Gia_Obj_t *)0x0 ||
              (iVar6 = Gia_ManPoIsToRemove(pGVar11,p->pObjs + iVar6,OutValue), iVar6 == 0)))) break;
          lVar19 = lVar19 + 1;
          pVVar12 = p->vCos;
          uVar17 = (ulong)pVVar12->nSize;
        } while (lVar19 < (long)(uVar17 - (long)p->nRegs));
      }
      if ((int)lVar19 == p->vCos->nSize - p->nRegs) {
        pGVar11 = p_00;
        Gia_ManAppendCo(p_00,0);
      }
      pVVar12 = p->vCos;
      if (0 < pVVar12->nSize) {
        lVar19 = 0;
        do {
          iVar6 = pVVar12->pArray[lVar19];
          if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_001e5845;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar3 = p->pObjs + iVar6;
          if (((fTrimCos == 0) || (iVar6 = Gia_ManPoIsToRemove(pGVar11,pGVar3,OutValue), iVar6 == 0)
              ) || ((uVar13 = (uint)*(undefined8 *)pGVar3,
                    (~uVar13 & 0x1fffffff) != 0 && (int)uVar13 < 0 &&
                    (p->vCos->nSize - p->nRegs <=
                     (int)((uint)((ulong)*(undefined8 *)pGVar3 >> 0x20) & 0x1fffffff))))) {
            if ((int)pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].Value < 0)
            goto LAB_001e5883;
            pGVar11 = p_00;
            Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar3 >> 0x1d & 1 ^
                                 pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].Value);
          }
          lVar19 = lVar19 + 1;
          pVVar12 = p->vCos;
        } while (lVar19 < pVVar12->nSize);
      }
      Gia_ManSetRegNum(p_00,p->nRegs);
    }
    else {
      if (0 < __ptr->nSize) {
        lVar19 = 0;
        do {
          iVar6 = __ptr->pArray[lVar19];
          uVar5 = iVar6 * 2;
          uVar13 = p->vCos->nSize;
          uVar18 = uVar13 - p->nRegs;
          if (uVar18 == uVar5 || SBORROW4(uVar18,uVar5) != (int)(uVar18 + iVar6 * -2) < 0) {
LAB_001e58c1:
            __assert_fail("v < Gia_ManPoNum(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
          }
          if ((iVar6 < 0) ||
             (uVar13 == uVar5 || SBORROW4(uVar13,uVar5) != (int)(uVar13 + iVar6 * -2) < 0))
          goto LAB_001e58a2;
          iVar6 = p->vCos->pArray[uVar5];
          if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_001e5845;
          uVar18 = (uint)*(undefined8 *)(p->pObjs + iVar6);
          uVar13 = (p->pObjs + iVar6)[-(ulong)(uVar18 & 0x1fffffff)].Value;
          if ((int)uVar13 < 0) goto LAB_001e5883;
          Gia_ManAppendCo(p_00,uVar18 >> 0x1d & 1 ^ uVar13);
          uVar5 = uVar5 | 1;
          iVar6 = p->vCos->nSize;
          if (iVar6 - p->nRegs <= (int)uVar5) goto LAB_001e58c1;
          if (iVar6 <= (int)uVar5) goto LAB_001e58a2;
          iVar6 = p->vCos->pArray[uVar5];
          if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_001e5845;
          uVar5 = (uint)*(undefined8 *)(p->pObjs + iVar6);
          uVar13 = (p->pObjs + iVar6)[-(ulong)(uVar5 & 0x1fffffff)].Value;
          if ((int)uVar13 < 0) goto LAB_001e5883;
          Gia_ManAppendCo(p_00,uVar5 >> 0x1d & 1 ^ uVar13);
          lVar19 = lVar19 + 1;
        } while (lVar19 < __ptr->nSize);
      }
      if (p_00->vCos->nSize == p_00->nRegs) {
        Gia_ManAppendCo(p_00,0);
        Gia_ManAppendCo(p_00,0);
      }
      iVar6 = p->nRegs;
      if (0 < iVar6) {
        iVar16 = 0;
        do {
          iVar1 = p->vCos->nSize;
          uVar13 = (iVar1 - iVar6) + iVar16;
          if (((int)uVar13 < 0) || (iVar1 <= (int)uVar13)) {
LAB_001e58a2:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar1 = p->vCos->pArray[uVar13];
          if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_001e5845:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar3 = p->pObjs + iVar1;
          uVar5 = (uint)*(undefined8 *)pGVar3;
          uVar13 = pGVar3[-(ulong)(uVar5 & 0x1fffffff)].Value;
          if ((int)uVar13 < 0) {
LAB_001e5883:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          Gia_ManAppendCo(p_00,uVar5 >> 0x1d & 1 ^ uVar13);
          iVar16 = iVar16 + 1;
          iVar6 = p->nRegs;
        } while (iVar16 < iVar6);
      }
      Gia_ManSetRegNum(p_00,iVar6);
      pGVar11 = Gia_ManSeqStructSweep(p_00,1,1,0);
      Gia_ManStop(p_00);
      p_00 = pGVar11;
    }
    if (__ptr != (Vec_Int_t *)0x0) {
      if (__ptr->pArray != (int *)0x0) {
        free(__ptr->pArray);
        __ptr->pArray = (int *)0x0;
      }
      free(__ptr);
    }
    iVar6 = Gia_ManHasDangling(p_00);
    if (iVar6 != 0) {
      __assert_fail("!Gia_ManHasDangling( pNew )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                    ,0x8c2,"Gia_Man_t *Gia_ManDupTrimmed(Gia_Man_t *, int, int, int, int)");
    }
    return p_00;
  }
  pGVar9 = Gia_ManAppendObj(p_00);
  uVar17 = *(ulong *)pGVar9;
  *(ulong *)pGVar9 = uVar17 | 0x9fffffff;
  *(ulong *)pGVar9 =
       uVar17 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
  pGVar3 = p_00->pObjs;
  if ((pGVar3 <= pGVar9) && (pGVar9 < pGVar3 + p_00->nObjs)) {
    Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar3) >> 2) * -0x55555555);
    if ((p_00->pObjs <= pGVar9) && (pGVar9 < p_00->pObjs + p_00->nObjs)) goto LAB_001e526e;
  }
LAB_001e5864:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

Gia_Man_t * Gia_ManDupTrimmed( Gia_Man_t * p, int fTrimCis, int fTrimCos, int fDualOut, int OutValue )
{
    Vec_Int_t * vNonZero = NULL;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, Entry;
    // collect non-zero
    if ( fDualOut && fTrimCos )
        vNonZero = Gia_ManDupTrimmedNonZero( p );
    // start new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // check if there are PIs to be added
    Gia_ManCreateRefs( p );
    Gia_ManForEachPi( p, pObj, i )
        if ( !fTrimCis || Gia_ObjRefNum(p, pObj) )
            break;
    if ( i == Gia_ManPiNum(p) ) // there is no PIs - add dummy PI
        Gia_ManAppendCi(pNew);
    // add the ROs
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        if ( !fTrimCis || Gia_ObjRefNum(p, pObj) || Gia_ObjIsRo(p, pObj) )
            pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    if ( fDualOut && fTrimCos )
    {
        Vec_IntForEachEntry( vNonZero, Entry, i )
        {
            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(Gia_ManPo(p, 2*Entry+0)) );
            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(Gia_ManPo(p, 2*Entry+1)) );
        }
        if ( Gia_ManPoNum(pNew) == 0 ) // nothing - add dummy PO
        {
//            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(Gia_ManPo(p, 0)) );
//            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(Gia_ManPo(p, 1)) );
            Gia_ManAppendCo( pNew, 0 );
            Gia_ManAppendCo( pNew, 0 );
        }
        Gia_ManForEachRi( p, pObj, i )
            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
        // cleanup
        pNew = Gia_ManSeqStructSweep( pTemp = pNew, 1, 1, 0 );
        Gia_ManStop( pTemp );
        // trim the PIs
//        pNew = Gia_ManDupTrimmed( pTemp = pNew, 1, 0, 0 );
//        Gia_ManStop( pTemp );
    }
    else
    {
        // check if there are POs to be added
        Gia_ManForEachPo( p, pObj, i )
            if ( !fTrimCos || !Gia_ManPoIsToRemove(p, pObj, OutValue) )
                break;
        if ( i == Gia_ManPoNum(p) ) // there is no POs - add dummy PO
            Gia_ManAppendCo( pNew, 0 );
        Gia_ManForEachCo( p, pObj, i )
            if ( !fTrimCos || !Gia_ManPoIsToRemove(p, pObj, OutValue) || Gia_ObjIsRi(p, pObj) )
                Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    }
    Vec_IntFreeP( &vNonZero );
    assert( !Gia_ManHasDangling( pNew ) );
    return pNew;
}